

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

void asmjit::BaseCompiler_assignGenericName(BaseCompiler *self,VirtReg *vReg)

{
  uint uVar1;
  char buf [64];
  
  uVar1 = snprintf(buf,0x40,"%%%u",(ulong)(vReg->_id - 0x100));
  if (uVar1 - 1 < 0x3f) {
    ZoneString<16UL>::setData(&vReg->_name,&(self->super_BaseBuilder)._dataZone,buf,(ulong)uVar1);
    return;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/compiler.cpp"
             ,0xf6,"size > 0 && size < int(ASMJIT_ARRAY_SIZE(buf))");
}

Assistant:

static void BaseCompiler_assignGenericName(BaseCompiler* self, VirtReg* vReg) {
  uint32_t index = unsigned(Operand::virtIdToIndex(vReg->_id));

  char buf[64];
  int size = snprintf(buf, ASMJIT_ARRAY_SIZE(buf), "%%%u", unsigned(index));

  ASMJIT_ASSERT(size > 0 && size < int(ASMJIT_ARRAY_SIZE(buf)));
  vReg->_name.setData(&self->_dataZone, buf, unsigned(size));
}